

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

string * __thiscall
wabt::anon_unknown_0::CWriter::DefineImportName
          (string *__return_storage_ptr__,CWriter *this,string *name,string_view module,
          string_view mangled_field_name)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  string *extraout_RAX;
  string *psVar4;
  size_type *psVar5;
  undefined8 uVar6;
  string_view name_00;
  undefined1 local_b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  char *local_70 [2];
  char local_60 [16];
  string local_50;
  
  name_00.size_ = (CWriter *)module.data_;
  name_00.data_ = (char *)module.size_;
  (anonymous_namespace)::CWriter::MangleName_abi_cxx11_((string *)&local_90,name_00.size_,name_00);
  string_view::to_string_abi_cxx11_(&local_50,&mangled_field_name);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_allocated_capacity != &local_80) {
    uVar6 = local_80._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_50._M_string_length + local_90._8_8_) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      uVar6 = local_50.field_2._M_allocated_capacity;
    }
    if (local_50._M_string_length + local_90._8_8_ <= (ulong)uVar6) {
      plVar3 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_50,0,(char *)0x0,local_90._M_allocated_capacity);
      goto LAB_00142ffa;
    }
  }
  plVar3 = (long *)std::__cxx11::string::_M_append
                             (local_90._M_local_buf,(ulong)local_50._M_dataplus._M_p);
LAB_00142ffa:
  local_b0._0_8_ = local_b0 + 0x10;
  psVar4 = (string *)(plVar3 + 2);
  if ((string *)*plVar3 == psVar4) {
    local_b0._16_8_ = (psVar4->_M_dataplus)._M_p;
    local_b0._24_8_ = plVar3[3];
  }
  else {
    local_b0._16_8_ = (psVar4->_M_dataplus)._M_p;
    local_b0._0_8_ = (string *)*plVar3;
  }
  local_b0._8_8_ = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)&(psVar4->_M_dataplus)._M_p = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_allocated_capacity != &local_80) {
    operator_delete((void *)local_90._M_allocated_capacity);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->import_syms_,name);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->global_syms_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_90._M_allocated_capacity = (size_type)&local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + name->_M_string_length);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,local_b0._0_8_,(pointer)(local_b0._0_8_ + local_b0._8_8_));
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&this->global_sym_map_,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_90);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_allocated_capacity != &local_80) {
    operator_delete((void *)local_90._M_allocated_capacity);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,"(*"
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  plVar3 = (long *)std::__cxx11::string::append(local_90._M_local_buf);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_allocated_capacity != &local_80) {
    operator_delete((void *)local_90._M_allocated_capacity);
  }
  psVar4 = (string *)(local_b0 + 0x10);
  if ((string *)local_b0._0_8_ != psVar4) {
    operator_delete((void *)local_b0._0_8_);
    psVar4 = extraout_RAX;
  }
  return psVar4;
}

Assistant:

std::string CWriter::DefineImportName(const std::string& name,
                                      string_view module,
                                      string_view mangled_field_name) {
  std::string mangled = MangleName(module) + mangled_field_name.to_string();
  import_syms_.insert(name);
  global_syms_.insert(mangled);
  global_sym_map_.insert(SymbolMap::value_type(name, mangled));
  return "(*" + mangled + ")";
}